

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O0

void highsOpenLogFile(HighsOptions *options,string *log_file)

{
  string *in_RSI;
  string *in_stack_00000040;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  highsOpenLogFile((HighsLogOptions *)options,
                   (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)log_file,
                   in_stack_00000040);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void highsOpenLogFile(HighsOptions& options, const std::string log_file) {
  highsOpenLogFile(options.log_options, options.records, log_file);
}